

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall GameBoard::canPut(GameBoard *this,int color,int blockType)

{
  bool bVar1;
  int in_EDX;
  int in_ESI;
  GameBoard *in_RDI;
  int o;
  int y;
  int x;
  Tetris t;
  int local_4c;
  int local_48;
  int local_44;
  Tetris local_40;
  int local_18;
  int local_14;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  Tetris::Tetris(&local_40,in_RDI,in_EDX,in_ESI);
  local_44 = 0x14;
  do {
    if (local_44 < 1) {
      return false;
    }
    for (local_48 = 1; local_48 < 0xb; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        Tetris::set(&local_40,local_44,local_48,local_4c);
        bVar1 = Tetris::isValid(&local_40,-1,-1,-1);
        if ((bVar1) &&
           (bVar1 = checkDirectDropTo(in_RDI,local_14,local_18,local_44,local_48,local_4c), bVar1))
        {
          return true;
        }
      }
    }
    local_44 = local_44 + -1;
  } while( true );
}

Assistant:

bool GameBoard::canPut(int color, int blockType)
{
    Tetris t(this, blockType, color);
    for (int x = MAPHEIGHT; x >= 1; x--)
        for (int y = 1; y <= MAPWIDTH; y++)
            for (int o = 0; o < 4; o++) {
                t.set(x, y, o);
                if (t.isValid() && checkDirectDropTo(color, blockType, x, y, o))
                    return true;
            }
    return false;
}